

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

void __thiscall wasm::TableInit::finalize(TableInit *this)

{
  (this->super_SpecificExpression<(wasm::Expression::Id)51>).super_Expression.type.id = 0;
  if ((((this->dest->type).id == 1) || ((this->offset->type).id == 1)) ||
     ((this->size->type).id == 1)) {
    (this->super_SpecificExpression<(wasm::Expression::Id)51>).super_Expression.type.id = 1;
  }
  return;
}

Assistant:

void TableInit::finalize() {
  type = Type::none;
  if (dest->type == Type::unreachable || offset->type == Type::unreachable ||
      size->type == Type::unreachable) {
    type = Type::unreachable;
  }
}